

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  string local_50;
  ReusableStringStream local_30;
  SourceLineInfo local_18;
  
  pIVar2 = getCurrentMutableContext();
  iVar1 = (*(pIVar2->super_IContext)._vptr_IContext[2])(pIVar2);
  if ((IResultCapture *)CONCAT44(extraout_var,iVar1) != (IResultCapture *)0x0) {
    return (IResultCapture *)CONCAT44(extraout_var,iVar1);
  }
  ReusableStringStream::ReusableStringStream(&local_30);
  local_18.file =
       "/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/build_O2/_deps/catch2-src/single_include/catch2/catch.hpp"
  ;
  local_18.line = 0x3354;
  operator<<(local_30.m_oss,&local_18);
  std::operator<<(local_30.m_oss,": Internal Catch2 error: ");
  std::operator<<(local_30.m_oss,"No result capture instance");
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_50);
}

Assistant:

inline IContext& getCurrentContext()
    {
        return getCurrentMutableContext();
    }